

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O2

void dlep_writer_add_tlv2
               (dlep_writer *writer,uint16_t type,void *data1,uint16_t len1,void *data2,
               uint16_t len2)

{
  undefined2 in_register_0000000a;
  undefined2 in_register_0000008a;
  undefined1 local_34 [2];
  undefined1 local_32 [2];
  
  abuf_memcpy(writer->out,local_32,2);
  abuf_memcpy(writer->out,local_34,2);
  abuf_memcpy(writer->out,data1,CONCAT22(in_register_0000000a,len1));
  abuf_memcpy(writer->out,data2,CONCAT22(in_register_0000008a,len2));
  return;
}

Assistant:

void
dlep_writer_add_tlv2(
  struct dlep_writer *writer, uint16_t type, const void *data1, uint16_t len1, const void *data2, uint16_t len2) {
  abuf_append_uint16(writer->out, htons(type));
  abuf_append_uint16(writer->out, htons(len1 + len2));
  abuf_memcpy(writer->out, data1, len1);
  abuf_memcpy(writer->out, data2, len2);
}